

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refdbm.cc
# Opt level: O3

bool tchecker::refdbm::has_fixed_value(db_t *rdbm,reference_clock_variables_t *r,clock_id_t x)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  
  if (rdbm == (db_t *)0x0) {
    __assert_fail("rdbm != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x390,
                  "bool tchecker::refdbm::has_fixed_value(const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, tchecker::clock_id_t)"
                 );
  }
  bVar2 = is_consistent(rdbm,r);
  if (!bVar2) {
    __assert_fail("tchecker::refdbm::is_consistent(rdbm, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x391,
                  "bool tchecker::refdbm::has_fixed_value(const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, tchecker::clock_id_t)"
                 );
  }
  bVar2 = is_tight(rdbm,r);
  if (!bVar2) {
    __assert_fail("tchecker::refdbm::is_tight(rdbm, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x392,
                  "bool tchecker::refdbm::has_fixed_value(const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, tchecker::clock_id_t)"
                 );
  }
  uVar1 = *(stored_size_type *)
           ((long)&(r->super_flat_clock_variables_t).
                   super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._index._key_map.m_flat_tree.m_data + 8);
  if (uVar1 == *(stored_size_type *)
                ((long)&(r->super_flat_clock_variables_t).
                        super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._index._value_map.m_flat_tree.m_data + 8)) {
    if (x < uVar1) {
      uVar3 = 0;
      if (r->_refcount <= x) {
        uVar3 = (r->_refmap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start[x];
      }
      if ((((uint)rdbm[(int)uVar1 * x + uVar3] & 1) == 0) ||
         (((uint)rdbm[uVar3 * (int)uVar1 + x] & 1) == 0)) {
        bVar2 = false;
      }
      else {
        bVar2 = ((int)rdbm[(int)uVar1 * x + uVar3] >> 1) + ((int)rdbm[uVar3 * (int)uVar1 + x] >> 1)
                == 0;
      }
      return bVar2;
    }
    __assert_fail("x < r.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x393,
                  "bool tchecker::refdbm::has_fixed_value(const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, tchecker::clock_id_t)"
                 );
  }
  __assert_fail("_key_map.size() == _value_map.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/index.hh"
                ,0x90,
                "size_t tchecker::index_t<unsigned int, std::basic_string<char>>::size() const [KEY = unsigned int, T = std::basic_string<char>]"
               );
}

Assistant:

bool has_fixed_value(tchecker::dbm::db_t const * rdbm, tchecker::reference_clock_variables_t const & r, tchecker::clock_id_t x)
{
  assert(rdbm != nullptr);
  assert(tchecker::refdbm::is_consistent(rdbm, r));
  assert(tchecker::refdbm::is_tight(rdbm, r));
  assert(x < r.size());

  tchecker::clock_id_t const rdim = r.size();
  tchecker::clock_id_t const rx = (x < r.refcount() ? 0 : r.refmap()[x]);

  return (tchecker::dbm::comparator(RDBM(x, rx)) == tchecker::LE) && (tchecker::dbm::comparator(RDBM(rx, x)) == tchecker::LE) &&
         (tchecker::dbm::value(RDBM(rx, x)) == -tchecker::dbm::value(RDBM(x, rx)));
}